

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FieldGenerator::SetRuntimeHasBit
          (FieldGenerator *this,int has_index)

{
  mapped_type *this_00;
  AlphaNum *a;
  allocator local_81;
  key_type local_80;
  string local_60;
  AlphaNum local_40;
  
  strings::AlphaNum::AlphaNum(&local_40,has_index);
  StrCat_abi_cxx11_(&local_60,(protobuf *)&local_40,a);
  std::__cxx11::string::string((string *)&local_80,"has_index",&local_81);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->variables_,&local_80);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void FieldGenerator::SetRuntimeHasBit(int has_index) {
  variables_["has_index"] = StrCat(has_index);
}